

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrapMode.cpp
# Opt level: O1

Function * wasm::generateBinaryFunc(Module *wasm,Binary *curr)

{
  Type TVar1;
  _Head_base<0UL,_wasm::Function_*,_false> _Var2;
  BinaryOp BVar3;
  Expression *pEVar4;
  Expression *pEVar5;
  Binary *this;
  Const *pCVar6;
  Binary *pBVar7;
  Binary *this_00;
  Binary *this_01;
  Unary *this_02;
  If *this_03;
  BinaryOp BVar8;
  initializer_list<wasm::Type> types;
  Signature sig;
  Name NVar9;
  Name name;
  Literal local_110;
  Literal local_f8;
  Literal local_e0;
  Literal local_c8;
  anon_union_16_5_9943fe1e_for_Literal_0 local_b0;
  undefined8 local_a0;
  Type local_98;
  HeapType local_90;
  Binary *local_88;
  Const *local_80;
  anon_union_16_5_9943fe1e_for_Literal_0 local_78;
  undefined8 local_68;
  _Head_base<0UL,_wasm::Function_*,_false> local_60;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> func;
  Builder local_38;
  Builder builder;
  
  BVar8 = curr->op;
  TVar1.id = (curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id;
  local_88 = curr;
  local_38.wasm = wasm;
  pEVar4 = (Expression *)MixedArena::allocSpace(&wasm->allocator,0x18,8);
  pEVar4->_id = LocalGetId;
  pEVar4[1]._id = InvalidId;
  (pEVar4->type).id = TVar1.id;
  pEVar5 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
  pEVar5->_id = LocalGetId;
  pEVar5[1]._id = BlockId;
  (pEVar5->type).id = TVar1.id;
  this = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
  (this->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this->op = BVar8;
  this->left = pEVar4;
  this->right = pEVar5;
  Binary::finalize(this);
  BVar3 = DivSInt32;
  if (TVar1.id == 3) {
    BVar3 = DivSInt64;
    local_b0.i64 = -0x8000000000000000;
    local_a0 = 3;
    local_78.i64 = 0;
    local_68 = 3;
  }
  else {
    local_b0.i32 = 0x80000000;
    local_a0 = 2;
    local_78.func.super_IString.str._M_len =
         (ulong)(uint)local_78.func.super_IString.str._M_len._4_4_ << 0x20;
    local_68 = 2;
  }
  if (BVar8 == BVar3) {
    BVar8 = EqInt32;
    if (TVar1.id == 3) {
      func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
           (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
           (__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)0xffffffffffffffff
      ;
      BVar8 = EqInt64;
    }
    else {
      func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._0_4_ = 0xffffffff;
    }
    pEVar4 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
    pEVar4->_id = LocalGetId;
    pEVar4[1]._id = InvalidId;
    (pEVar4->type).id = TVar1.id;
    Literal::Literal(&local_110,(Literal *)&local_b0.func);
    pCVar6 = Builder::makeConst(&local_38,&local_110);
    pBVar7 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
    (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar7->op = BVar8;
    pBVar7->left = pEVar4;
    pBVar7->right = (Expression *)pCVar6;
    Binary::finalize(pBVar7);
    pEVar4 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
    pEVar4->_id = LocalGetId;
    pEVar4[1]._id = BlockId;
    (pEVar4->type).id = TVar1.id;
    Literal::Literal(&local_f8,(Literal *)&func);
    local_80 = Builder::makeConst(&local_38,&local_f8);
    this_00 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    this_00->op = BVar8;
    this_00->left = pEVar4;
    this_00->right = (Expression *)local_80;
    Binary::finalize(this_00);
    this_01 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
    (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    this_01->op = AndInt32;
    this_01->left = (Expression *)pBVar7;
    this_01->right = (Expression *)this_00;
    Binary::finalize(this_01);
    Literal::Literal(&local_e0,(Literal *)&local_78.func);
    pCVar6 = Builder::makeConst(&local_38,&local_e0);
    pBVar7 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
    (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = IfId;
    (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    *(Binary **)&pBVar7->op = this_01;
    pBVar7->left = (Expression *)pCVar6;
    pBVar7->right = (Expression *)this;
    If::finalize((If *)pBVar7);
    Literal::~Literal(&local_e0);
    Literal::~Literal(&local_f8);
    Literal::~Literal(&local_110);
    Literal::~Literal((Literal *)&func);
    this = pBVar7;
  }
  types._M_len = 2;
  types._M_array = (iterator)&func;
  func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)TVar1.id;
  Type::Type(&local_98,types);
  NVar9 = getBinaryFuncName(local_88);
  sig.results.id = TVar1.id;
  sig.params.id = local_98.id;
  HeapType::HeapType(&local_90,sig);
  func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
       (__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)0x0;
  name.super_IString.str._M_str = NVar9.super_IString.str._M_len;
  name.super_IString.str._M_len = (size_t)&local_60;
  Builder::makeFunction
            (name,(HeapType)NVar9.super_IString.str._M_str,
             (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_90.id,(Expression *)&func);
  if ((__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)
      func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)0x0) {
    operator_delete((void *)func._M_t.
                            super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                            .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
                    -(long)func._M_t.
                           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                           .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
  }
  pEVar4 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
  pEVar4->_id = LocalGetId;
  pEVar4[1]._id = BlockId;
  (pEVar4->type).id = TVar1.id;
  this_02 = (Unary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
  (this_02->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
  (this_02->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
  this_02->op = TVar1.id == 3 | EqZInt32;
  this_02->value = pEVar4;
  Unary::finalize(this_02);
  Literal::Literal(&local_c8,(Literal *)&local_78.func);
  pCVar6 = Builder::makeConst(&local_38,&local_c8);
  this_03 = (If *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
  (this_03->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id = IfId;
  (this_03->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id = 0;
  this_03->condition = (Expression *)this_02;
  this_03->ifTrue = (Expression *)pCVar6;
  this_03->ifFalse = (Expression *)this;
  If::finalize(this_03);
  (local_60._M_head_impl)->body = (Expression *)this_03;
  Literal::~Literal(&local_c8);
  _Var2._M_head_impl = local_60._M_head_impl;
  local_60._M_head_impl = (Function *)0x0;
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
            ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&local_60);
  Literal::~Literal((Literal *)&local_78.func);
  Literal::~Literal((Literal *)&local_b0.func);
  return _Var2._M_head_impl;
}

Assistant:

Function* generateBinaryFunc(Module& wasm, Binary* curr) {
  BinaryOp op = curr->op;
  Type type = curr->type;
  bool isI64 = type == Type::i64;
  Builder builder(wasm);
  Expression* result = builder.makeBinary(
    op, builder.makeLocalGet(0, type), builder.makeLocalGet(1, type));
  BinaryOp divSIntOp = isI64 ? DivSInt64 : DivSInt32;
  UnaryOp eqZOp = isI64 ? EqZInt64 : EqZInt32;
  Literal minLit = isI64 ? Literal(std::numeric_limits<int64_t>::min())
                         : Literal(std::numeric_limits<int32_t>::min());
  Literal zeroLit = isI64 ? Literal(int64_t(0)) : Literal(int32_t(0));
  if (op == divSIntOp) {
    // guard against signed division overflow
    BinaryOp eqOp = isI64 ? EqInt64 : EqInt32;
    Literal negLit = isI64 ? Literal(int64_t(-1)) : Literal(int32_t(-1));
    result = builder.makeIf(
      builder.makeBinary(
        AndInt32,
        builder.makeBinary(
          eqOp, builder.makeLocalGet(0, type), builder.makeConst(minLit)),
        builder.makeBinary(
          eqOp, builder.makeLocalGet(1, type), builder.makeConst(negLit))),
      builder.makeConst(zeroLit),
      result);
  }
  auto funcSig = Signature({type, type}, type);
  auto func = Builder::makeFunction(getBinaryFuncName(curr), funcSig, {});
  func->body =
    builder.makeIf(builder.makeUnary(eqZOp, builder.makeLocalGet(1, type)),
                   builder.makeConst(zeroLit),
                   result);
  // TODO: use unique_ptr properly and do not release ownership.
  return func.release();
}